

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_auth.c
# Opt level: O0

void tnt_scramble_prepare(void *out,void *salt,void *pass,int plen)

{
  undefined1 local_b4 [8];
  SHA1_CTX ctx;
  uchar hash2 [20];
  uchar local_38 [8];
  uchar hash1 [20];
  int plen_local;
  void *pass_local;
  void *salt_local;
  void *out_local;
  
  hash1._12_4_ = plen;
  unique0x10000177 = (uchar *)pass;
  SHA1Init((SHA1_CTX *)local_b4);
  SHA1Update((SHA1_CTX *)local_b4,stack0xffffffffffffffe0,hash1._12_4_);
  SHA1Final(local_38,(SHA1_CTX *)local_b4);
  SHA1Init((SHA1_CTX *)local_b4);
  SHA1Update((SHA1_CTX *)local_b4,local_38,0x14);
  SHA1Final(ctx.buffer + 0x38,(SHA1_CTX *)local_b4);
  SHA1Init((SHA1_CTX *)local_b4);
  SHA1Update((SHA1_CTX *)local_b4,(uchar *)salt,0x14);
  SHA1Update((SHA1_CTX *)local_b4,ctx.buffer + 0x38,0x14);
  SHA1Final((uchar *)out,(SHA1_CTX *)local_b4);
  tnt_xor((uchar *)out,local_38,(uchar *)out,0x14);
  return;
}

Assistant:

static inline void
tnt_scramble_prepare(void *out, const void *salt, const void *pass, int plen)
{
	unsigned char hash1[TNT_SCRAMBLE_SIZE];
	unsigned char hash2[TNT_SCRAMBLE_SIZE];
	SHA1_CTX ctx;

	SHA1Init(&ctx);
	SHA1Update(&ctx, (const unsigned char *) pass, plen);
	SHA1Final(hash1, &ctx);

	SHA1Init(&ctx);
	SHA1Update(&ctx, hash1, TNT_SCRAMBLE_SIZE);
	SHA1Final(hash2, &ctx);

	SHA1Init(&ctx);
	SHA1Update(&ctx, (const unsigned char *) salt, TNT_SCRAMBLE_SIZE);
	SHA1Update(&ctx, hash2, TNT_SCRAMBLE_SIZE);
	SHA1Final((unsigned char *) out, &ctx);

	tnt_xor((unsigned char *) out, hash1, (const unsigned char *) out,
	       TNT_SCRAMBLE_SIZE);
}